

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void countFinalize(sqlite3_context *context)

{
  i64 *piVar1;
  undefined8 local_28;
  CountCtx *p;
  sqlite3_context *context_local;
  
  piVar1 = (i64 *)sqlite3_aggregate_context(context,0);
  if (piVar1 == (i64 *)0x0) {
    local_28 = 0;
  }
  else {
    local_28 = *piVar1;
  }
  sqlite3_result_int64(context,local_28);
  return;
}

Assistant:

static void countFinalize(sqlite3_context *context){
  CountCtx *p;
  p = sqlite3_aggregate_context(context, 0);
  sqlite3_result_int64(context, p ? p->n : 0);
}